

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FillBoundary<int>
          (FabArray<amrex::IArrayBox> *this,Periodicity *period,bool cross)

{
  undefined1 in_DL;
  FabArray<amrex::IArrayBox> *in_RSI;
  FabArray<amrex::IArrayBox> *in_RDI;
  int r;
  int local_40;
  int iVar1;
  IntVect *nghost;
  int in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffdc;
  uint scomp;
  
  scomp = CONCAT13(in_DL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  nghost = &(in_RDI->super_FabArrayBase).n_grow;
  if ((in_RDI->super_FabArrayBase).n_grow.vect[1] < nghost->vect[0]) {
    iVar1 = nghost->vect[0];
  }
  else {
    iVar1 = (in_RDI->super_FabArrayBase).n_grow.vect[1];
  }
  local_40 = iVar1;
  if (iVar1 <= (in_RDI->super_FabArrayBase).n_grow.vect[2]) {
    local_40 = (in_RDI->super_FabArrayBase).n_grow.vect[2];
  }
  if (0 < local_40) {
    FabArrayBase::nComp(&in_RDI->super_FabArrayBase);
    FillBoundary_nowait<int>
              (in_RSI,scomp,in_stack_ffffffffffffffd8,nghost,(Periodicity *)in_RDI,
               SUB41((uint)iVar1 >> 0x18,0));
    FillBoundary_finish<int,_amrex::IArrayBox,_0>(in_RDI);
  }
  return;
}

Assistant:

void
FabArray<FAB>::FillBoundary (const Periodicity& period, bool cross)
{
    BL_PROFILE("FabArray::FillBoundary()");
    if ( n_grow.max() > 0 ) {
        FillBoundary_nowait<BUF>(0, nComp(), n_grow, period, cross);
        FillBoundary_finish<BUF>();
    }
}